

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration.cpp
# Opt level: O2

int main(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraData;
  PlatformFolders p;
  string local_38;
  PlatformFolders local_10;
  
  sago::getConfigHome_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getDataHome_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getCacheDir_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getDesktopFolder_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getDocumentsFolder_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getDownloadFolder_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getDownloadFolder1_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getPicturesFolder_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getPublicFolder_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getMusicFolder_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getVideoFolder_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getSaveGamesFolder1_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::getSaveGamesFolder2_abi_cxx11_();
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::PlatformFolders::PlatformFolders(&local_10);
  sago::PlatformFolders::getDocumentsFolder_abi_cxx11_(&local_38,&local_10);
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::PlatformFolders::getDesktopFolder_abi_cxx11_(&local_38,&local_10);
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::PlatformFolders::getPicturesFolder_abi_cxx11_(&local_38,&local_10);
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::PlatformFolders::getMusicFolder_abi_cxx11_(&local_38,&local_10);
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::PlatformFolders::getVideoFolder_abi_cxx11_(&local_38,&local_10);
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::PlatformFolders::getDownloadFolder1_abi_cxx11_(&local_38,&local_10);
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  sago::PlatformFolders::getSaveGamesFolder1_abi_cxx11_(&local_38,&local_10);
  run_test(&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  local_38._M_dataplus._M_p = (pointer)0x0;
  local_38._M_string_length = 0;
  local_38.field_2._M_allocated_capacity = 0;
  sago::appendAdditionalDataDirectories
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_38);
  run_test((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_38);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_38);
  sago::PlatformFolders::~PlatformFolders(&local_10);
  return 0;
}

Assistant:

int main() {
	// Test plain functions
	run_test(sago::getConfigHome());
	run_test(sago::getDataHome());
	run_test(sago::getCacheDir());
	// Test non-member functions
	run_test(sago::getDesktopFolder());
	run_test(sago::getDocumentsFolder());
	run_test(sago::getDownloadFolder());
	run_test(sago::getDownloadFolder1());
	run_test(sago::getPicturesFolder());
	run_test(sago::getPublicFolder());
	run_test(sago::getMusicFolder());
	run_test(sago::getVideoFolder());
	run_test(sago::getSaveGamesFolder1());
	run_test(sago::getSaveGamesFolder2());
	// Test class methods
	sago::PlatformFolders p;
	run_test(p.getDocumentsFolder());
	run_test(p.getDesktopFolder());
	run_test(p.getPicturesFolder());
	run_test(p.getMusicFolder());
	run_test(p.getVideoFolder());
	run_test(p.getDownloadFolder1());
	run_test(p.getSaveGamesFolder1());
	// Test vector function
	std::vector<std::string> extraData;
	sago::appendAdditionalDataDirectories(extraData);
	run_test(extraData);
	return 0;
}